

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void stack_node_release(StackNode *self,StackNodeArray *pool,SubtreePool *subtree_pool)

{
  Subtree self_00;
  undefined8 *puVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  StackNode **__ptr;
  SubtreePool *pool_00;
  Subtree *pSVar5;
  StackNode *pSVar6;
  StackNodeArray *pool_01;
  long *__nmemb;
  ulong uVar7;
  
  do {
    if (self->ref_count == 0) {
      __assert_fail("self->ref_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                    ,0x60,"void stack_node_release(StackNode *, StackNodeArray *, SubtreePool *)");
    }
    uVar3 = self->ref_count - 1;
    self->ref_count = uVar3;
    if (uVar3 != 0) {
      return;
    }
    if (self->link_count == 0) {
      pSVar6 = (StackNode *)0x0;
    }
    else {
      uVar4 = self->link_count - 1;
      if (uVar4 != 0) {
        uVar7 = (ulong)uVar4;
        pSVar5 = &self->links[uVar7].subtree;
        do {
          uVar7 = uVar7 - 1;
          pSVar6 = (StackNode *)pSVar5[-1].ptr;
          if ((*pSVar5).ptr != (SubtreeHeapData *)0x0) {
            ts_subtree_release(subtree_pool,*pSVar5);
          }
          stack_node_release(pSVar6,pool,subtree_pool);
          pSVar5 = pSVar5 + -3;
        } while ((int)uVar7 != 0);
      }
      self_00 = self->links[0].subtree;
      if (self_00.ptr != (SubtreeHeapData *)0x0) {
        ts_subtree_release(subtree_pool,self_00);
      }
      pSVar6 = self->links[0].node;
    }
    uVar4 = pool->size;
    if (uVar4 < 0x32) {
      __ptr = pool->contents;
      if (uVar4 == pool->capacity) {
        uVar2 = uVar4 * 2;
        if (uVar4 * 2 < 9) {
          uVar2 = 8;
        }
        __nmemb = (long *)(ulong)uVar2;
        if (__ptr == (StackNode **)0x0) {
          pool_01 = (StackNodeArray *)&DAT_00000008;
          __ptr = (StackNode **)calloc((size_t)__nmemb,8);
          if (__ptr == (StackNode **)0x0) goto LAB_0012fe67;
        }
        else {
          pool_01 = (StackNodeArray *)((long)__nmemb * 8);
          __ptr = (StackNode **)realloc(__ptr,(size_t)pool_01);
          if (__ptr == (StackNode **)0x0) {
            stack_node_release_cold_1();
LAB_0012fe67:
            stack_node_release_cold_2();
            if (*__nmemb == 0) {
              return;
            }
            if ((*(Subtree *)(__nmemb + 1)).ptr != (SubtreeHeapData *)0x0) {
              ts_subtree_release(pool_00,*(Subtree *)(__nmemb + 1));
            }
            puVar1 = (undefined8 *)__nmemb[2];
            if (puVar1 != (undefined8 *)0x0) {
              free((void *)*puVar1);
              *puVar1 = 0;
              puVar1[1] = 0;
              free((void *)__nmemb[2]);
            }
            stack_node_release((StackNode *)*__nmemb,pool_01,pool_00);
            return;
          }
          uVar4 = pool->size;
        }
        pool->contents = __ptr;
        pool->capacity = uVar2;
      }
      pool->size = uVar4 + 1;
      __ptr[uVar4] = self;
    }
    else {
      free(self);
    }
    self = pSVar6;
    if (pSVar6 == (StackNode *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void stack_node_release(StackNode *self, StackNodeArray *pool, SubtreePool *subtree_pool) {
recur:
  assert(self->ref_count != 0);
  self->ref_count--;
  if (self->ref_count > 0) return;

  StackNode *first_predecessor = NULL;
  if (self->link_count > 0) {
    for (unsigned i = self->link_count - 1; i > 0; i--) {
      StackLink link = self->links[i];
      if (link.subtree.ptr) ts_subtree_release(subtree_pool, link.subtree);
      stack_node_release(link.node, pool, subtree_pool);
    }
    StackLink link = self->links[0];
    if (link.subtree.ptr) ts_subtree_release(subtree_pool, link.subtree);
    first_predecessor = self->links[0].node;
  }

  if (pool->size < MAX_NODE_POOL_SIZE) {
    array_push(pool, self);
  } else {
    ts_free(self);
  }

  if (first_predecessor) {
    self = first_predecessor;
    goto recur;
  }
}